

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ravi_alloc.c
# Opt level: O3

void dispose_chunk(mstate m,mchunkptr p,size_t psize)

{
  tbinptr pmVar1;
  char *pcVar2;
  size_t __len;
  tbinptr pmVar3;
  tbinptr pmVar4;
  malloc_tree_chunk *pmVar5;
  byte bVar6;
  long lVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  malloc_tree_chunk *pmVar11;
  ulong uVar12;
  long lVar13;
  malloc_tree_chunk *pmVar14;
  tbinptr pmVar15;
  
  pmVar1 = (tbinptr)((long)&p->prev_foot + psize);
  if ((p->head & 1) == 0) {
    uVar12 = p->prev_foot;
    if ((p->head & 2) == 0) {
      __len = psize + 0x20 + uVar12;
      iVar8 = munmap((void *)((long)p - uVar12),__len);
      if (iVar8 != 0) {
        return;
      }
      m->footprint = m->footprint - __len;
      return;
    }
    pmVar3 = (tbinptr)m->least_addr;
    p = (mchunkptr)((long)p - uVar12);
    if (p < pmVar3) goto LAB_00156b23;
    psize = psize + uVar12;
    if ((tbinptr)p == (tbinptr)m->dv) {
      uVar12 = pmVar1->head;
      if ((~(uint)uVar12 & 3) == 0) {
        m->dvsize = psize;
        pmVar1->head = uVar12 & 0xfffffffffffffffe;
        ((tbinptr)p)->head = psize | 1;
        pmVar1->prev_foot = psize;
        return;
      }
    }
    else if (uVar12 < 0x100) {
      pmVar4 = ((tbinptr)p)->fd;
      pmVar15 = ((tbinptr)p)->bk;
      if ((pmVar4 != (tbinptr)(m->smallbins + (uVar12 >> 3) * 2)) &&
         ((pmVar4 < pmVar3 || (pmVar4->bk != (malloc_tree_chunk *)p)))) goto LAB_00156b23;
      if (pmVar15 == pmVar4) {
        bVar6 = (byte)(uVar12 >> 3) & 0x1f;
        m->smallmap = m->smallmap & (-2 << bVar6 | 0xfffffffeU >> 0x20 - bVar6);
      }
      else {
        if ((pmVar15 != (tbinptr)(m->smallbins + (uVar12 >> 3) * 2)) &&
           ((pmVar15 < pmVar3 || (pmVar15->fd != (malloc_tree_chunk *)p)))) goto LAB_00156b23;
        pmVar4->bk = pmVar15;
        pmVar15->fd = pmVar4;
      }
    }
    else {
      pmVar14 = ((tbinptr)p)->bk;
      pmVar11 = ((tbinptr)p)->child[2];
      if (pmVar14 == (malloc_tree_chunk *)p) {
        if (((tbinptr)p)->child[1] == (malloc_tree_chunk *)0x0) {
          if (((tbinptr)p)->child[0] == (malloc_tree_chunk *)0x0) {
            pmVar14 = (malloc_tree_chunk *)0x0;
            goto LAB_001566cc;
          }
          pmVar5 = ((tbinptr)p)->child[0];
          pmVar4 = (tbinptr)((tbinptr)p)->child;
        }
        else {
          pmVar5 = ((tbinptr)p)->child[1];
          pmVar4 = (tbinptr)(((tbinptr)p)->child + 1);
        }
        do {
          do {
            pmVar15 = pmVar4;
            pmVar14 = pmVar5;
            pmVar5 = pmVar14->child[1];
            pmVar4 = (tbinptr)(pmVar14->child + 1);
          } while (pmVar14->child[1] != (malloc_tree_chunk *)0x0);
          pmVar5 = pmVar14->child[0];
          pmVar4 = (tbinptr)pmVar14->child;
        } while (pmVar14->child[0] != (malloc_tree_chunk *)0x0);
        if (pmVar15 < pmVar3) goto LAB_00156b23;
        pmVar15->prev_foot = 0;
      }
      else {
        pmVar4 = ((tbinptr)p)->fd;
        if (((pmVar4 < pmVar3) || (pmVar4->bk != (malloc_tree_chunk *)p)) ||
           (pmVar14->fd != (malloc_tree_chunk *)p)) goto LAB_00156b23;
        pmVar4->bk = pmVar14;
        pmVar14->fd = pmVar4;
      }
LAB_001566cc:
      if (pmVar11 != (malloc_tree_chunk *)0x0) {
        uVar10 = *(uint *)(((tbinptr)p)->child + 3);
        if ((tbinptr)p == m->treebins[uVar10]) {
          m->treebins[uVar10] = pmVar14;
          if (pmVar14 == (malloc_tree_chunk *)0x0) {
            bVar6 = (byte)uVar10 & 0x1f;
            m->treemap = m->treemap & (-2 << bVar6 | 0xfffffffeU >> 0x20 - bVar6);
          }
          else {
LAB_0015670e:
            pmVar5 = (malloc_tree_chunk *)m->least_addr;
            if (pmVar14 < pmVar5) goto LAB_00156b23;
            pmVar14->child[2] = pmVar11;
            pmVar11 = ((tbinptr)p)->child[0];
            if (pmVar11 != (malloc_tree_chunk *)0x0) {
              if (pmVar11 < pmVar5) goto LAB_00156b23;
              pmVar14->child[0] = pmVar11;
              pmVar11->child[2] = pmVar14;
            }
            pmVar11 = ((tbinptr)p)->child[1];
            if (pmVar11 != (malloc_tree_chunk *)0x0) {
              if (pmVar11 < (malloc_tree_chunk *)m->least_addr) goto LAB_00156b23;
              pmVar14->child[1] = pmVar11;
              pmVar11->parent = pmVar14;
            }
          }
        }
        else {
          if (pmVar11 < (malloc_tree_chunk *)m->least_addr) goto LAB_00156b23;
          pmVar11->child[pmVar11->child[0] != (malloc_tree_chunk *)p] = pmVar14;
          if (pmVar14 != (malloc_tree_chunk *)0x0) goto LAB_0015670e;
        }
      }
    }
  }
  pmVar3 = (tbinptr)m->least_addr;
  if (pmVar1 < pmVar3) goto LAB_00156b23;
  uVar12 = pmVar1->head;
  if ((uVar12 & 2) == 0) {
    if (pmVar1 == (tbinptr)m->top) {
      uVar12 = psize + m->topsize;
      m->topsize = uVar12;
      m->top = p;
      ((tbinptr)p)->head = uVar12 | 1;
      if ((tbinptr)p != (tbinptr)m->dv) {
        return;
      }
      m->dv = (mchunkptr)0x0;
      m->dvsize = 0;
      return;
    }
    if (pmVar1 == (tbinptr)m->dv) {
      uVar12 = psize + m->dvsize;
      m->dvsize = uVar12;
      m->dv = p;
      ((tbinptr)p)->head = uVar12 | 1;
      *(ulong *)((long)((tbinptr)p)->child + (uVar12 - 0x20)) = uVar12;
      return;
    }
    if (uVar12 < 0x100) {
      pmVar4 = pmVar1->fd;
      pmVar15 = pmVar1->bk;
      if ((pmVar4 != (tbinptr)(m->smallbins + (uVar12 >> 3) * 2)) &&
         ((pmVar4 < pmVar3 || (pmVar4->bk != pmVar1)))) goto LAB_00156b23;
      if (pmVar15 == pmVar4) {
        bVar6 = (byte)(uVar12 >> 3) & 0x1f;
        m->smallmap = m->smallmap & (-2 << bVar6 | 0xfffffffeU >> 0x20 - bVar6);
      }
      else {
        if ((pmVar15 != (tbinptr)(m->smallbins + (uVar12 >> 3) * 2)) &&
           ((pmVar15 < pmVar3 || (pmVar15->fd != pmVar1)))) goto LAB_00156b23;
        pmVar4->bk = pmVar15;
        pmVar15->fd = pmVar4;
      }
    }
    else {
      pmVar14 = pmVar1->bk;
      pmVar11 = pmVar1->child[2];
      if (pmVar14 == pmVar1) {
        if (pmVar1->child[1] == (malloc_tree_chunk *)0x0) {
          if (pmVar1->child[0] == (malloc_tree_chunk *)0x0) {
            pmVar14 = (malloc_tree_chunk *)0x0;
            goto LAB_00156a63;
          }
          pmVar5 = pmVar1->child[0];
          pmVar4 = (tbinptr)pmVar1->child;
        }
        else {
          pmVar5 = pmVar1->child[1];
          pmVar4 = (tbinptr)(pmVar1->child + 1);
        }
        do {
          do {
            pmVar15 = pmVar4;
            pmVar14 = pmVar5;
            pmVar5 = pmVar14->child[1];
            pmVar4 = (tbinptr)(pmVar14->child + 1);
          } while (pmVar14->child[1] != (malloc_tree_chunk *)0x0);
          pmVar5 = pmVar14->child[0];
          pmVar4 = (tbinptr)pmVar14->child;
        } while (pmVar14->child[0] != (malloc_tree_chunk *)0x0);
        if (pmVar15 < pmVar3) goto LAB_00156b23;
        pmVar15->prev_foot = 0;
      }
      else {
        pmVar4 = pmVar1->fd;
        if (((pmVar4 < pmVar3) || (pmVar4->bk != pmVar1)) || (pmVar14->fd != pmVar1))
        goto LAB_00156b23;
        pmVar4->bk = pmVar14;
        pmVar14->fd = pmVar4;
      }
LAB_00156a63:
      if (pmVar11 != (malloc_tree_chunk *)0x0) {
        uVar10 = *(uint *)(pmVar1->child + 3);
        if (pmVar1 == m->treebins[uVar10]) {
          m->treebins[uVar10] = pmVar14;
          if (pmVar14 == (malloc_tree_chunk *)0x0) {
            bVar6 = (byte)uVar10 & 0x1f;
            m->treemap = m->treemap & (-2 << bVar6 | 0xfffffffeU >> 0x20 - bVar6);
          }
          else {
LAB_00156aa1:
            pmVar5 = (malloc_tree_chunk *)m->least_addr;
            if (pmVar14 < pmVar5) goto LAB_00156b23;
            pmVar14->child[2] = pmVar11;
            pmVar11 = pmVar1->child[0];
            if (pmVar11 != (malloc_tree_chunk *)0x0) {
              if (pmVar11 < pmVar5) goto LAB_00156b23;
              pmVar14->child[0] = pmVar11;
              pmVar11->child[2] = pmVar14;
            }
            pmVar11 = pmVar1->child[1];
            if (pmVar11 != (malloc_tree_chunk *)0x0) {
              if (pmVar11 < (malloc_tree_chunk *)m->least_addr) goto LAB_00156b23;
              pmVar14->child[1] = pmVar11;
              pmVar11->parent = pmVar14;
            }
          }
        }
        else {
          if (pmVar11 < (malloc_tree_chunk *)m->least_addr) goto LAB_00156b23;
          pmVar11->child[pmVar11->child[0] != pmVar1] = pmVar14;
          if (pmVar14 != (malloc_tree_chunk *)0x0) goto LAB_00156aa1;
        }
      }
    }
    psize = psize + (uVar12 & 0xfffffffffffffff8);
    ((tbinptr)p)->head = psize | 1;
    *(size_t *)((long)((tbinptr)p)->child + (psize - 0x20)) = psize;
    if ((tbinptr)p == (tbinptr)m->dv) {
      m->dvsize = psize;
      return;
    }
  }
  else {
    pmVar1->head = uVar12 & 0xfffffffffffffffe;
    ((tbinptr)p)->head = psize | 1;
    *(size_t *)((long)((tbinptr)p)->child + (psize - 0x20)) = psize;
  }
  if (psize < 0x100) {
    pmVar14 = (malloc_tree_chunk *)(m->smallbins + (psize >> 3) * 2);
    uVar10 = (uint)(psize >> 3);
    if ((m->smallmap >> (uVar10 & 0x1f) & 1) == 0) {
      m->smallmap = m->smallmap | 1 << (uVar10 & 0x1f);
      pmVar11 = pmVar14;
    }
    else {
      pmVar11 = pmVar14->fd;
      if (pmVar14->fd < (malloc_tree_chunk *)m->least_addr) {
LAB_00156b23:
        abort();
      }
    }
    pmVar14->fd = (malloc_tree_chunk *)p;
    pmVar11->bk = (malloc_tree_chunk *)p;
    ((tbinptr)p)->fd = pmVar11;
    ((tbinptr)p)->bk = pmVar14;
  }
  else {
    uVar10 = (uint)(psize >> 8);
    if (uVar10 == 0) {
      uVar9 = 0;
    }
    else {
      uVar9 = 0x1f;
      if (uVar10 < 0x10000) {
        uVar9 = ((uint)(psize >> ((ulong)(byte)(0x26 - (char)LZCOUNT(uVar10)) & 0x3f)) & 1) +
                LZCOUNT(uVar10) * 2 ^ 0x3e;
      }
    }
    *(uint *)(((tbinptr)p)->child + 3) = uVar9;
    pmVar14 = (malloc_tree_chunk *)(m->treebins + uVar9);
    ((tbinptr)p)->child[0] = (malloc_tree_chunk *)0x0;
    ((tbinptr)p)->child[1] = (malloc_tree_chunk *)0x0;
    if ((m->treemap >> (uVar9 & 0x1f) & 1) == 0) {
      m->treemap = m->treemap | 1 << (uVar9 & 0x1f);
      pmVar14->prev_foot = (size_t)p;
      ((tbinptr)p)->child[2] = pmVar14;
    }
    else {
      uVar12 = (ulong)(byte)(0x39 - (char)(uVar9 >> 1));
      if (uVar9 == 0x1f) {
        uVar12 = 0;
      }
      lVar13 = psize << (uVar12 & 0x3f);
      pmVar14 = (malloc_tree_chunk *)pmVar14->prev_foot;
      do {
        pmVar11 = pmVar14;
        if ((pmVar11->head & 0xfffffffffffffff8) == psize) {
          if (((malloc_tree_chunk *)m->least_addr <= pmVar11) &&
             (pmVar14 = pmVar11->fd, (malloc_tree_chunk *)m->least_addr <= pmVar14)) {
            pmVar14->bk = (malloc_tree_chunk *)p;
            pmVar11->fd = (malloc_tree_chunk *)p;
            ((tbinptr)p)->fd = pmVar14;
            ((tbinptr)p)->bk = pmVar11;
            ((tbinptr)p)->child[2] = (malloc_tree_chunk *)0x0;
            return;
          }
          goto LAB_00156b23;
        }
        lVar7 = lVar13 >> 0x3f;
        lVar13 = lVar13 * 2;
        pmVar14 = *(malloc_tree_chunk **)((long)pmVar11 + lVar7 * -8 + 0x20);
      } while (pmVar14 != (malloc_tree_chunk *)0x0);
      pcVar2 = (char *)((long)pmVar11 + lVar7 * -8 + 0x20);
      if (pcVar2 < m->least_addr) goto LAB_00156b23;
      *(mchunkptr *)pcVar2 = p;
      ((tbinptr)p)->child[2] = pmVar11;
    }
    ((tbinptr)p)->bk = (malloc_tree_chunk *)p;
    ((tbinptr)p)->fd = (malloc_tree_chunk *)p;
  }
  return;
}

Assistant:

static void dispose_chunk(mstate m, mchunkptr p, size_t psize) {
  mchunkptr next = chunk_plus_offset(p, psize);
  if (!pinuse(p)) {
    mchunkptr prev;
    size_t prevsize = p->prev_foot;
    if (is_mmapped(p)) {
      psize += prevsize + MMAP_FOOT_PAD;
      if (CALL_MUNMAP((char*)p - prevsize, psize) == 0)
        m->footprint -= psize;
      return;
    }
    prev = chunk_minus_offset(p, prevsize);
    psize += prevsize;
    p = prev;
    if (RTCHECK(ok_address(m, prev))) { /* consolidate backward */
      if (p != m->dv) {
        unlink_chunk(m, p, prevsize);
      }
      else if ((next->head & INUSE_BITS) == INUSE_BITS) {
        m->dvsize = psize;
        set_free_with_pinuse(p, psize, next);
        return;
      }
    }
    else {
      CORRUPTION_ERROR_ACTION(m);
      return;
    }
  }
  if (RTCHECK(ok_address(m, next))) {
    if (!cinuse(next)) {  /* consolidate forward */
      if (next == m->top) {
        size_t tsize = m->topsize += psize;
        m->top = p;
        p->head = tsize | PINUSE_BIT;
        if (p == m->dv) {
          m->dv = 0;
          m->dvsize = 0;
        }
        return;
      }
      else if (next == m->dv) {
        size_t dsize = m->dvsize += psize;
        m->dv = p;
        set_size_and_pinuse_of_free_chunk(p, dsize);
        return;
      }
      else {
        size_t nsize = chunksize(next);
        psize += nsize;
        unlink_chunk(m, next, nsize);
        set_size_and_pinuse_of_free_chunk(p, psize);
        if (p == m->dv) {
          m->dvsize = psize;
          return;
        }
      }
    }
    else {
      set_free_with_pinuse(p, psize, next);
    }
    insert_chunk(m, p, psize);
  }
  else {
    CORRUPTION_ERROR_ACTION(m);
  }
}